

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O2

png_charp png_format_number(png_const_charp start,png_charp end,int format,png_alloc_size_t number)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  png_charp pcVar4;
  int iVar5;
  int iVar6;
  
  end[-1] = '\0';
  pcVar4 = end + -1;
  iVar6 = 1;
  iVar5 = 0;
  bVar1 = false;
  do {
    if ((pcVar4 <= start) || (iVar6 <= iVar5 && number == 0)) {
      return pcVar4;
    }
    switch(format) {
    case 2:
      iVar6 = 2;
    case 1:
      pcVar4[-1] = "0123456789ABCDEF"[number % 10];
      pcVar4 = pcVar4 + -1;
      goto LAB_001194c6;
    case 4:
      iVar6 = 2;
    case 3:
      pcVar4[-1] = "0123456789ABCDEF"[(uint)number & 0xf];
      pcVar4 = pcVar4 + -1;
      number = number >> 4;
      break;
    case 5:
      uVar3 = number % 10;
      if (bVar1 || uVar3 != 0) {
        pcVar4[-1] = "0123456789ABCDEF"[uVar3];
        pcVar4 = pcVar4 + -1;
      }
      bVar1 = bVar1 || uVar3 != 0;
      iVar6 = 5;
LAB_001194c6:
      number = number / 10;
      break;
    default:
      number = 0;
    }
    if (((format == 5) && (iVar5 == 4)) && (start < pcVar4)) {
      cVar2 = '.';
      if (!bVar1) {
        if (number != 0) goto LAB_0011950b;
        cVar2 = '0';
      }
      pcVar4[-1] = cVar2;
      pcVar4 = pcVar4 + -1;
    }
LAB_0011950b:
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

png_charp
png_format_number(png_const_charp start, png_charp end, int format,
    png_alloc_size_t number)
{
   int count = 0;    /* number of digits output */
   int mincount = 1; /* minimum number required */
   int output = 0;   /* digit output (for the fixed point format) */

   *--end = '\0';

   /* This is written so that the loop always runs at least once, even with
    * number zero.
    */
   while (end > start && (number != 0 || count < mincount))
   {

      static const char digits[] = "0123456789ABCDEF";

      switch (format)
      {
         case PNG_NUMBER_FORMAT_fixed:
            /* Needs five digits (the fraction) */
            mincount = 5;
            if (output != 0 || number % 10 != 0)
            {
               *--end = digits[number % 10];
               output = 1;
            }
            number /= 10;
            break;

         case PNG_NUMBER_FORMAT_02u:
            /* Expects at least 2 digits. */
            mincount = 2;
            /* FALLTHROUGH */

         case PNG_NUMBER_FORMAT_u:
            *--end = digits[number % 10];
            number /= 10;
            break;

         case PNG_NUMBER_FORMAT_02x:
            /* This format expects at least two digits */
            mincount = 2;
            /* FALLTHROUGH */

         case PNG_NUMBER_FORMAT_x:
            *--end = digits[number & 0xf];
            number >>= 4;
            break;

         default: /* an error */
            number = 0;
            break;
      }

      /* Keep track of the number of digits added */
      ++count;

      /* Float a fixed number here: */
      if ((format == PNG_NUMBER_FORMAT_fixed) && (count == 5) && (end > start))
      {
         /* End of the fraction, but maybe nothing was output?  In that case
          * drop the decimal point.  If the number is a true zero handle that
          * here.
          */
         if (output != 0)
            *--end = '.';
         else if (number == 0) /* and !output */
            *--end = '0';
      }
   }

   return end;
}